

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void show_seg_usage(void)

{
  undefined4 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [14];
  undefined1 auVar5 [12];
  unkbyte10 Var6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uchar (*pauVar11) [8192];
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM2_Ba;
  char cVar35;
  undefined1 in_XMM2_Bb;
  char cVar36;
  undefined1 in_XMM2_Bc;
  char cVar37;
  undefined1 in_XMM2_Bd;
  char cVar38;
  undefined1 in_XMM2_Be;
  char cVar39;
  undefined1 in_XMM2_Bf;
  char cVar40;
  undefined1 in_XMM2_Bg;
  char cVar41;
  undefined1 in_XMM2_Bh;
  char cVar42;
  undefined1 in_XMM2_Bi;
  char cVar43;
  undefined1 in_XMM2_Bj;
  char cVar44;
  undefined1 in_XMM2_Bk;
  char cVar45;
  undefined1 in_XMM2_Bl;
  char cVar46;
  undefined1 in_XMM2_Bm;
  char cVar47;
  undefined1 in_XMM2_Bn;
  char cVar48;
  undefined1 in_XMM2_Bo;
  char cVar49;
  undefined1 in_XMM2_Bp;
  char cVar50;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined2 uVar34;
  
  uVar10 = machine->ram_base;
  puts("segment usage:");
  putchar(10);
  if (max_bank != 0) {
    puts("\t\t\t\t    USED/FREE");
  }
  if (max_zp < 2) {
    puts("      ZP    -");
  }
  else {
    printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n",(ulong)uVar10,
           (ulong)((uVar10 + max_zp) - 1),(ulong)(uint)max_zp,(ulong)(uint)max_zp,
           (ulong)(0x100 - max_zp));
  }
  if (max_bss < 0x202) {
    puts("     BSS    -");
  }
  else {
    printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n");
  }
  if (max_bank < 0) {
    uVar10 = 0;
    uVar15 = 0;
  }
  else {
    pauVar11 = map;
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))) ==
                   CONCAT13(in_XMM2_Bd,CONCAT12(in_XMM2_Bc,CONCAT11(in_XMM2_Bb,in_XMM2_Ba))));
    cVar35 = (char)iVar9;
    cVar36 = (char)((uint)iVar9 >> 8);
    cVar37 = (char)((uint)iVar9 >> 0x10);
    cVar38 = (char)((uint)iVar9 >> 0x18);
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))) ==
                   CONCAT13(in_XMM2_Bh,CONCAT12(in_XMM2_Bg,CONCAT11(in_XMM2_Bf,in_XMM2_Be))));
    cVar39 = (char)iVar9;
    cVar40 = (char)((uint)iVar9 >> 8);
    cVar41 = (char)((uint)iVar9 >> 0x10);
    cVar42 = (char)((uint)iVar9 >> 0x18);
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))) ==
                   CONCAT13(in_XMM2_Bl,CONCAT12(in_XMM2_Bk,CONCAT11(in_XMM2_Bj,in_XMM2_Bi))));
    cVar43 = (char)iVar9;
    cVar44 = (char)((uint)iVar9 >> 8);
    cVar45 = (char)((uint)iVar9 >> 0x10);
    cVar46 = (char)((uint)iVar9 >> 0x18);
    iVar9 = -(uint)(CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))) ==
                   CONCAT13(in_XMM2_Bp,CONCAT12(in_XMM2_Bo,CONCAT11(in_XMM2_Bn,in_XMM2_Bm))));
    cVar47 = (char)iVar9;
    cVar48 = (char)((uint)iVar9 >> 8);
    cVar49 = (char)((uint)iVar9 >> 0x10);
    cVar50 = (char)((uint)iVar9 >> 0x18);
    lVar16 = 0;
    iVar14 = 0;
    iVar9 = 0;
    uVar13 = 0;
    do {
      iVar17 = 0;
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      lVar7 = 0;
      do {
        uVar1 = *(undefined4 *)(*pauVar11 + lVar7);
        auVar21[0] = -((char)uVar1 == cVar35);
        auVar21[1] = -((char)((uint)uVar1 >> 8) == cVar36);
        auVar21[2] = -((char)((uint)uVar1 >> 0x10) == cVar37);
        auVar21[3] = -((char)((uint)uVar1 >> 0x18) == cVar38);
        auVar21[4] = -(cVar39 == '\0');
        auVar21[5] = -(cVar40 == '\0');
        auVar21[6] = -(cVar41 == '\0');
        auVar21[7] = -(cVar42 == '\0');
        auVar21[8] = -(cVar43 == '\0');
        auVar21[9] = -(cVar44 == '\0');
        auVar21[10] = -(cVar45 == '\0');
        auVar21[0xb] = -(cVar46 == '\0');
        auVar21[0xc] = -(cVar47 == '\0');
        auVar21[0xd] = -(cVar48 == '\0');
        auVar21[0xe] = -(cVar49 == '\0');
        auVar21[0xf] = -(cVar50 == '\0');
        auVar3[1] = cVar36;
        auVar3[0] = cVar35;
        auVar3[2] = cVar37;
        auVar3[3] = cVar38;
        auVar3[4] = cVar39;
        auVar3[5] = cVar40;
        auVar3[6] = cVar41;
        auVar3[7] = cVar42;
        auVar3[8] = cVar43;
        auVar3[9] = cVar44;
        auVar3[10] = cVar45;
        auVar3[0xb] = cVar46;
        auVar3[0xc] = cVar47;
        auVar3[0xd] = cVar48;
        auVar3[0xe] = cVar49;
        auVar3[0xf] = cVar50;
        auVar21 = auVar21 ^ auVar3;
        auVar29._0_14_ = auVar21._0_14_;
        auVar29[0xe] = auVar21[7];
        auVar29[0xf] = auVar21[7];
        auVar28._14_2_ = auVar29._14_2_;
        auVar28._0_13_ = auVar21._0_13_;
        auVar28[0xd] = auVar21[6];
        auVar27._13_3_ = auVar28._13_3_;
        auVar27._0_12_ = auVar21._0_12_;
        auVar27[0xc] = auVar21[6];
        auVar26._12_4_ = auVar27._12_4_;
        auVar26._0_11_ = auVar21._0_11_;
        auVar26[0xb] = auVar21[5];
        auVar25._11_5_ = auVar26._11_5_;
        auVar25._0_10_ = auVar21._0_10_;
        auVar25[10] = auVar21[5];
        auVar24._10_6_ = auVar25._10_6_;
        auVar24._0_9_ = auVar21._0_9_;
        auVar24[9] = auVar21[4];
        auVar23._9_7_ = auVar24._9_7_;
        auVar23._0_8_ = auVar21._0_8_;
        auVar23[8] = auVar21[4];
        Var6 = CONCAT91(CONCAT81(auVar23._8_8_,auVar21[3]),auVar21[3]);
        auVar5._2_10_ = Var6;
        auVar5[1] = auVar21[2];
        auVar5[0] = auVar21[2];
        auVar4._2_12_ = auVar5;
        auVar4[1] = auVar21[1];
        auVar4[0] = auVar21[1];
        auVar22._0_2_ = CONCAT11(auVar21[0],auVar21[0]);
        auVar22._2_14_ = auVar4;
        uVar34 = (undefined2)Var6;
        auVar32._0_12_ = auVar22._0_12_;
        auVar32._12_2_ = uVar34;
        auVar32._14_2_ = uVar34;
        auVar31._12_4_ = auVar32._12_4_;
        auVar31._0_10_ = auVar22._0_10_;
        auVar31._10_2_ = auVar5._0_2_;
        auVar30._10_6_ = auVar31._10_6_;
        auVar30._0_8_ = auVar22._0_8_;
        auVar30._8_2_ = auVar5._0_2_;
        auVar33._8_8_ = auVar30._8_8_;
        auVar33._6_2_ = auVar4._0_2_;
        auVar33._4_2_ = auVar4._0_2_;
        auVar33._2_2_ = auVar22._0_2_;
        auVar33._0_2_ = auVar22._0_2_;
        auVar33 = auVar33 & _DAT_00113c10;
        iVar17 = iVar17 + auVar33._0_4_;
        iVar18 = iVar18 + auVar33._4_4_;
        iVar19 = iVar19 + auVar33._8_4_;
        iVar20 = iVar20 + auVar33._12_4_;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x2000);
      iVar17 = iVar20 + iVar18 + iVar19 + iVar17;
      if (iVar17 == 0) {
        printf("BANK %2X  %-23s       0/8192\n",uVar13 & 0xffffffff,bank_name + uVar13);
        iVar18 = -(uint)(CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))) ==
                        CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))));
        cVar35 = (char)iVar18;
        cVar36 = (char)((uint)iVar18 >> 8);
        cVar37 = (char)((uint)iVar18 >> 0x10);
        cVar38 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))) ==
                        CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))));
        cVar39 = (char)iVar18;
        cVar40 = (char)((uint)iVar18 >> 8);
        cVar41 = (char)((uint)iVar18 >> 0x10);
        cVar42 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))) ==
                        CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))));
        cVar43 = (char)iVar18;
        cVar44 = (char)((uint)iVar18 >> 8);
        cVar45 = (char)((uint)iVar18 >> 0x10);
        cVar46 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))) ==
                        CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))));
        cVar47 = (char)iVar18;
        cVar48 = (char)((uint)iVar18 >> 8);
        cVar49 = (char)((uint)iVar18 >> 0x10);
        cVar50 = (char)((uint)iVar18 >> 0x18);
      }
      else {
        printf("BANK %2X  %-23s    %4i/%4i\n",uVar13 & 0xffffffff,bank_name + uVar13,iVar17,
               (ulong)(0x2000U - iVar17));
        iVar18 = -(uint)(CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))) ==
                        CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))));
        cVar35 = (char)iVar18;
        cVar36 = (char)((uint)iVar18 >> 8);
        cVar37 = (char)((uint)iVar18 >> 0x10);
        cVar38 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))) ==
                        CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))));
        cVar39 = (char)iVar18;
        cVar40 = (char)((uint)iVar18 >> 8);
        cVar41 = (char)((uint)iVar18 >> 0x10);
        cVar42 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))) ==
                        CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))));
        cVar43 = (char)iVar18;
        cVar44 = (char)((uint)iVar18 >> 8);
        cVar45 = (char)((uint)iVar18 >> 0x10);
        cVar46 = (char)((uint)iVar18 >> 0x18);
        iVar18 = -(uint)(CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))) ==
                        CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))));
        cVar47 = (char)iVar18;
        cVar48 = (char)((uint)iVar18 >> 8);
        cVar49 = (char)((uint)iVar18 >> 0x10);
        cVar50 = (char)((uint)iVar18 >> 0x18);
        if (dump_seg != 1) {
          iVar18 = 0;
          do {
            lVar8 = (long)iVar18;
            lVar12 = lVar8 << 0x20;
            lVar7 = lVar8 + -1;
            iVar19 = iVar18;
            while (map[0][lVar16 + lVar8] == 0xff) {
              lVar8 = lVar8 + 1;
              lVar12 = lVar12 + 0x100000000;
              iVar19 = iVar19 + 1;
              lVar7 = lVar7 + 1;
              if ((int)lVar8 == 0x2000) goto LAB_0010f002;
            }
            section = map[uVar13][lVar12 >> 0x20] & 0xf;
            page = (map[uVar13][lVar12 >> 0x20] & 0xffffffe0) * 0x100;
            iVar20 = (int)lVar8;
            iVar18 = iVar20;
            if (lVar8 < 0x2000) {
              do {
                iVar18 = iVar19;
                if ((byte)section != ((*pauVar11)[lVar7 + 1] & 0xf)) goto LAB_0010ef92;
                lVar7 = lVar7 + 1;
                iVar19 = iVar18 + 1;
              } while (lVar7 < 0x1fff);
              iVar18 = 0x2000;
            }
LAB_0010ef92:
            printf("    %s    $%04X-$%04X  [%4i]\n",section_name + (uint)section,
                   (ulong)(uint)(page + iVar20),(ulong)((page + iVar18) - 1),
                   (ulong)(uint)(iVar18 - iVar20));
            iVar19 = -(uint)(CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))) ==
                            CONCAT13(cVar38,CONCAT12(cVar37,CONCAT11(cVar36,cVar35))));
            cVar35 = (char)iVar19;
            cVar36 = (char)((uint)iVar19 >> 8);
            cVar37 = (char)((uint)iVar19 >> 0x10);
            cVar38 = (char)((uint)iVar19 >> 0x18);
            iVar19 = -(uint)(CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))) ==
                            CONCAT13(cVar42,CONCAT12(cVar41,CONCAT11(cVar40,cVar39))));
            cVar39 = (char)iVar19;
            cVar40 = (char)((uint)iVar19 >> 8);
            cVar41 = (char)((uint)iVar19 >> 0x10);
            cVar42 = (char)((uint)iVar19 >> 0x18);
            iVar19 = -(uint)(CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))) ==
                            CONCAT13(cVar46,CONCAT12(cVar45,CONCAT11(cVar44,cVar43))));
            cVar43 = (char)iVar19;
            cVar44 = (char)((uint)iVar19 >> 8);
            cVar45 = (char)((uint)iVar19 >> 0x10);
            cVar46 = (char)((uint)iVar19 >> 0x18);
            iVar19 = -(uint)(CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))) ==
                            CONCAT13(cVar50,CONCAT12(cVar49,CONCAT11(cVar48,cVar47))));
            cVar47 = (char)iVar19;
            cVar48 = (char)((uint)iVar19 >> 8);
            cVar49 = (char)((uint)iVar19 >> 0x10);
            cVar50 = (char)((uint)iVar19 >> 0x18);
          } while (iVar18 < 0x2000);
        }
      }
LAB_0010f002:
      iVar9 = iVar9 + iVar17;
      iVar14 = iVar14 + (0x2000U - iVar17);
      pauVar11 = pauVar11 + 1;
      lVar16 = lVar16 + 0x2000;
      bVar2 = (long)uVar13 < (long)max_bank;
      uVar13 = uVar13 + 1;
    } while (bVar2);
    uVar10 = iVar9 + 0x3ffU >> 10;
    uVar15 = iVar14 >> 10;
  }
  puts("\t\t\t\t    ---- ----");
  printf("\t\t\t\t    %4iK%4iK\n",(ulong)uVar10,(ulong)uVar15);
  printf("\n\t\t\tTOTAL SIZE =     %4iK\n",(ulong)(uVar10 + uVar15));
  return;
}

Assistant:

void
show_seg_usage(void)
{
	int i, j;
	int addr, start, stop, nb;
	int rom_used;
	int rom_free;
	int ram_base = machine->ram_base;

	printf("segment usage:\n");
	printf("\n");

	if (max_bank)
		printf("\t\t\t\t    USED/FREE\n");

	/* zp usage */
	if (max_zp <= 1)
		printf("      ZP    -\n");
	else {
		start = ram_base;
		stop  = ram_base + (max_zp - 1);
		printf("      ZP    $%04X-$%04X  [%4i]     %4i/%4i\n", start, stop, stop - start + 1, stop-start+1, 256-(stop-start+1));
	}

	/* bss usage */
	if (max_bss <= 0x201)
		printf("     BSS    -\n");
	else {
		start = ram_base + 0x200;
		stop  = ram_base + (max_bss - 1);
		printf("     BSS    $%04X-$%04X  [%4i]     %4i/%4i\n\n", start, stop, stop - start + 1, stop-start+1, 8192-(stop-start+1));
	}

	/* bank usage */
	rom_used = 0;
	rom_free = 0;

	/* scan banks */
	for (i = 0; i <= max_bank; i++) {
		start = 0;
		addr = 0;
		nb = 0;

		/* count used and free bytes */
		for (j = 0; j < 8192; j++)
			if (map[i][j] != 0xFF)
				nb++;

		/* update used/free counters */
		rom_used += nb;
		rom_free += 8192 - nb;

		/* display bank infos */
		if (nb)
			printf("BANK %2X  %-23s    %4i/%4i\n",
					i, bank_name[i], nb, 8192 - nb);
		else {
			printf("BANK %2X  %-23s       0/8192\n", i, bank_name[i]);
			continue;
		}

		/* scan */
		if (dump_seg == 1)
			continue;

		for (;;) {
			/* search section start */
			for (; addr < 8192; addr++)
				if (map[i][addr] != 0xFF)
					break;

			/* check for end of bank */
			if (addr > 8191)
				break;

			/* get section type */
			section = map[i][addr] & 0x0F;
			page = (map[i][addr] & 0xE0) << 8;
			start = addr;

			/* search section end */
			for (; addr < 8192; addr++)
				if ((map[i][addr] & 0x0F) != section)
					break;

			/* display section infos */
			printf("    %s    $%04X-$%04X  [%4i]\n",
					section_name[section],	/* section name */
				    start + page,			/* starting address */
					addr  + page - 1,		/* end address */
					addr  - start);			/* size */
		}
	}

	/* total */
	rom_used = (rom_used + 1023) >> 10;
	rom_free = (rom_free) >> 10;
	printf("\t\t\t\t    ---- ----\n");
	printf("\t\t\t\t    %4iK%4iK\n", rom_used, rom_free);
	printf("\n\t\t\tTOTAL SIZE =     %4iK\n", (rom_used + rom_free));
}